

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

CURLcode Curl_ssl_addsessionid
                   (Curl_easy *data,connectdata *conn,_Bool isProxy,void *ssl_sessionid,
                   size_t idsize,int sockindex)

{
  Curl_share *pCVar1;
  ulong uVar2;
  Curl_ssl_session *pCVar3;
  proxy_info *ppVar4;
  _Bool _Var5;
  uint uVar6;
  CURLcode CVar7;
  char *pcVar8;
  ulong uVar9;
  undefined7 in_register_00000011;
  ssl_primary_config *source;
  long lVar10;
  long *plVar11;
  Curl_ssl_session *session;
  int iVar12;
  char *local_58;
  
  source = &conn->ssl_config;
  if ((int)CONCAT71(in_register_00000011,isProxy) != 0) {
    source = &conn->proxy_ssl_config;
  }
  session = (data->state).session;
  if (session == (Curl_ssl_session *)0x0) {
LAB_00155223:
    CVar7 = CURLE_OK;
  }
  else {
    ppVar4 = (proxy_info *)&conn->host;
    if (isProxy) {
      ppVar4 = &conn->http_proxy;
    }
    lVar10 = session->age;
    pcVar8 = (*Curl_cstrdup)((ppVar4->host).name);
    if (pcVar8 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    uVar6 = (uint)*(undefined8 *)&(conn->bits).field_0x4;
    if ((uVar6 >> 8 & 1) == 0) {
      local_58 = (char *)0x0;
LAB_001550fb:
      iVar12 = -1;
      if ((uVar6 >> 9 & 1) != 0) {
        iVar12 = conn->conn_to_port;
      }
      pCVar1 = data->share;
      if ((pCVar1 == (Curl_share *)0x0) || ((pCVar1->specifier & 0x10) == 0)) {
        plVar11 = &(data->state).sessionage;
      }
      else {
        plVar11 = &pCVar1->sessionage;
      }
      uVar2 = (data->set).general_ssl.max_ssl_sessions;
      uVar9 = 1;
      if (uVar2 < 2) {
LAB_00155181:
        if (uVar9 == uVar2) goto LAB_00155186;
        session = (data->state).session + uVar9;
      }
      else {
        pCVar3 = (data->state).session;
        do {
          if (pCVar3[1].sessionid == (void *)0x0) goto LAB_00155181;
          if (pCVar3[1].age < lVar10) {
            session = pCVar3 + 1;
            lVar10 = pCVar3[1].age;
          }
          uVar9 = uVar9 + 1;
          pCVar3 = pCVar3 + 1;
        } while (uVar2 != uVar9);
LAB_00155186:
        Curl_ssl_kill_session(session);
      }
      session->sessionid = ssl_sessionid;
      session->idsize = idsize;
      session->age = *plVar11;
      (*Curl_cfree)(session->name);
      (*Curl_cfree)(session->conn_to_host);
      session->name = pcVar8;
      session->conn_to_host = local_58;
      session->conn_to_port = iVar12;
      session->remote_port = *(int *)(conn->primary_ip + (ulong)!isProxy * 4 + -0xe);
      session->scheme = conn->handler->scheme;
      _Var5 = Curl_clone_primary_ssl_config(source,&session->ssl_config);
      if (_Var5) goto LAB_00155223;
      Curl_free_primary_ssl_config(&session->ssl_config);
      session->sessionid = (void *)0x0;
      (*Curl_cfree)(pcVar8);
      (*Curl_cfree)(local_58);
    }
    else {
      local_58 = (*Curl_cstrdup)((conn->conn_to_host).name);
      if (local_58 != (char *)0x0) {
        uVar6 = (uint)*(undefined8 *)&(conn->bits).field_0x4;
        goto LAB_001550fb;
      }
      (*Curl_cfree)(pcVar8);
    }
    CVar7 = CURLE_OUT_OF_MEMORY;
  }
  return CVar7;
}

Assistant:

CURLcode Curl_ssl_addsessionid(struct Curl_easy *data,
                               struct connectdata *conn,
                               const bool isProxy,
                               void *ssl_sessionid,
                               size_t idsize,
                               int sockindex)
{
  size_t i;
  struct Curl_ssl_session *store;
  long oldest_age;
  char *clone_host;
  char *clone_conn_to_host;
  int conn_to_port;
  long *general_age;
#ifndef CURL_DISABLE_PROXY
  struct ssl_primary_config * const ssl_config = isProxy ?
    &conn->proxy_ssl_config :
    &conn->ssl_config;
  const char *hostname = isProxy ? conn->http_proxy.host.name :
    conn->host.name;
#else
  struct ssl_primary_config * const ssl_config = &conn->ssl_config;
  const char *hostname = conn->host.name;
#endif
  (void)sockindex;
  if(!data->state.session)
    return CURLE_OK;

  store = &data->state.session[0];
  oldest_age = data->state.session[0].age; /* zero if unused */
  DEBUGASSERT(SSL_SET_OPTION(primary.sessionid));

  clone_host = strdup(hostname);
  if(!clone_host)
    return CURLE_OUT_OF_MEMORY; /* bail out */

  if(conn->bits.conn_to_host) {
    clone_conn_to_host = strdup(conn->conn_to_host.name);
    if(!clone_conn_to_host) {
      free(clone_host);
      return CURLE_OUT_OF_MEMORY; /* bail out */
    }
  }
  else
    clone_conn_to_host = NULL;

  if(conn->bits.conn_to_port)
    conn_to_port = conn->conn_to_port;
  else
    conn_to_port = -1;

  /* Now we should add the session ID and the host name to the cache, (remove
     the oldest if necessary) */

  /* If using shared SSL session, lock! */
  if(SSLSESSION_SHARED(data)) {
    general_age = &data->share->sessionage;
  }
  else {
    general_age = &data->state.sessionage;
  }

  /* find an empty slot for us, or find the oldest */
  for(i = 1; (i < data->set.general_ssl.max_ssl_sessions) &&
        data->state.session[i].sessionid; i++) {
    if(data->state.session[i].age < oldest_age) {
      oldest_age = data->state.session[i].age;
      store = &data->state.session[i];
    }
  }
  if(i == data->set.general_ssl.max_ssl_sessions)
    /* cache is full, we must "kill" the oldest entry! */
    Curl_ssl_kill_session(store);
  else
    store = &data->state.session[i]; /* use this slot */

  /* now init the session struct wisely */
  store->sessionid = ssl_sessionid;
  store->idsize = idsize;
  store->age = *general_age;    /* set current age */
  /* free it if there's one already present */
  free(store->name);
  free(store->conn_to_host);
  store->name = clone_host;               /* clone host name */
  store->conn_to_host = clone_conn_to_host; /* clone connect to host name */
  store->conn_to_port = conn_to_port; /* connect to port number */
  /* port number */
  store->remote_port = isProxy ? (int)conn->port : conn->remote_port;
  store->scheme = conn->handler->scheme;

  if(!Curl_clone_primary_ssl_config(ssl_config, &store->ssl_config)) {
    Curl_free_primary_ssl_config(&store->ssl_config);
    store->sessionid = NULL; /* let caller free sessionid */
    free(clone_host);
    free(clone_conn_to_host);
    return CURLE_OUT_OF_MEMORY;
  }

  DEBUGF(infof(data, "Added Session ID to cache for %s://%s:%d [%s]",
               store->scheme, store->name, store->remote_port,
               isProxy ? "PROXY" : "server"));
  return CURLE_OK;
}